

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_return::run_impl(statement_return *this)

{
  proxy *ppVar1;
  runtime_type *prVar2;
  runtime_error *this_00;
  tree_node *local_40;
  _Alloc_hider local_38;
  
  if (*(long *)(current_process + 0x88) != *(long *)(current_process + 0x80)) {
    local_40 = (this->mTree).mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffffc8,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&local_40,0));
    prVar2 = (runtime_type *)
             stack_type<cs_impl::any,_std::allocator>::top
                       ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
    if ((runtime_type *)&stack0xffffffffffffffc8 != prVar2) {
      ppVar1 = (proxy *)(prVar2->literals).
                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                        .
                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                        .ctrl_;
      (prVar2->literals).
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = local_38._M_p;
      local_38._M_p = (pointer)ppVar1;
    }
    cs_impl::any::recycle((any *)&stack0xffffffffffffffc8);
    ((((this->super_statement_base).context.
       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->return_fcall = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"Return outside function.",(allocator *)&local_40);
  runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffc8);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void statement_return::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (current_process->stack.empty())
			throw runtime_error("Return outside function.");
		current_process->stack.top() = context->instance->parse_expr(this->mTree.root());
		context->instance->return_fcall = true;
	}